

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiNode *pNode)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  ValidateDSProcess *pVVar6;
  ulong uVar7;
  vector<bool,_std::allocator<bool>_> abHadMesh;
  ValidateDSProcess local_40;
  undefined8 local_20;
  
  if (pNode == (aiNode *)0x0) {
    ReportError(this,"A node of the scenegraph is NULL");
  }
  pVVar6 = this;
  Validate(this,&pNode->mName);
  pcVar1 = (pNode->mName).data;
  if ((this->mScene->mRootNode != pNode) && (pNode->mParent == (aiNode *)0x0)) {
    ReportError(pVVar6,"Non-root node %s lacks a valid parent (aiNode::mParent is NULL) ",pcVar1);
  }
  if (pNode->mNumMeshes != 0) {
    if (pNode->mMeshes == (uint *)0x0) {
      pcVar5 = "aiNode::mMeshes is NULL for node %s (aiNode::mNumMeshes is %i)";
      goto LAB_0030386c;
    }
    pVVar6 = &local_40;
    local_40.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
    local_40.super_BaseProcess.shared._0_4_ = 0;
    local_40.super_BaseProcess.progress = (ProgressHandler *)0x0;
    local_40.mScene._0_4_ = 0;
    local_20 = 0;
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)pVVar6,(ulong)this->mScene->mNumMeshes,false);
    if (pNode->mNumMeshes != 0) {
      uVar4 = 0;
      do {
        uVar2 = pNode->mMeshes[uVar4];
        uVar7 = (ulong)uVar2;
        uVar3 = this->mScene->mNumMeshes;
        if (uVar3 <= uVar2) {
          pcVar5 = "aiNode::mMeshes[%i] is out of range for node %s (maximum is %i)";
          uVar4 = (ulong)uVar2;
          uVar7 = (ulong)(uVar3 - 1);
LAB_00303833:
          ReportError(pVVar6,pcVar5,uVar4,pcVar1,uVar7);
        }
        pVVar6 = (ValidateDSProcess *)
                 (&((BaseProcess *)local_40.super_BaseProcess._vptr_BaseProcess)->_vptr_BaseProcess)
                 [uVar2 >> 6];
        if (((ulong)pVVar6 >> (uVar7 & 0x3f) & 1) != 0) {
          pcVar5 = "aiNode::mMeshes[%i] is already referenced by this node %s (value: %i)";
          goto LAB_00303833;
        }
        pVVar6 = (ValidateDSProcess *)((ulong)pVVar6 | 1L << ((byte)uVar2 & 0x3f));
        (&((BaseProcess *)local_40.super_BaseProcess._vptr_BaseProcess)->_vptr_BaseProcess)
        [uVar2 >> 6] = (_func_int **)pVVar6;
        uVar4 = uVar4 + 1;
      } while ((uint)uVar4 < pNode->mNumMeshes);
    }
    pVVar6 = (ValidateDSProcess *)local_40.super_BaseProcess._vptr_BaseProcess;
    if ((ValidateDSProcess *)local_40.super_BaseProcess._vptr_BaseProcess !=
        (ValidateDSProcess *)0x0) {
      operator_delete(local_40.super_BaseProcess._vptr_BaseProcess);
      local_40.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
      local_40.super_BaseProcess.shared._0_4_ = 0;
      local_40.super_BaseProcess.progress = (ProgressHandler *)0x0;
      local_40.mScene._0_4_ = 0;
      local_20 = 0;
    }
  }
  if (pNode->mNumChildren != 0) {
    if (pNode->mChildren == (aiNode **)0x0) {
      pcVar5 = "aiNode::mChildren is NULL for node %s (aiNode::mNumChildren is %i)";
LAB_0030386c:
      ReportError(pVVar6,pcVar5,pcVar1);
    }
    if (pNode->mNumChildren != 0) {
      uVar4 = 0;
      do {
        Validate(this,pNode->mChildren[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar4 < pNode->mNumChildren);
    }
  }
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiNode* pNode)
{
    if (!pNode) {
    	ReportError("A node of the scenegraph is NULL");
    }
    // Validate node name string first so that it's safe to use in below expressions
    this->Validate(&pNode->mName);
    const char* nodeName = (&pNode->mName)->C_Str();
    if (pNode != mScene->mRootNode && !pNode->mParent){
        ReportError("Non-root node %s lacks a valid parent (aiNode::mParent is NULL) ", nodeName);
    }

    // validate all meshes
    if (pNode->mNumMeshes)
    {
        if (!pNode->mMeshes)
        {
            ReportError("aiNode::mMeshes is NULL for node %s (aiNode::mNumMeshes is %i)",
            		  nodeName, pNode->mNumMeshes);
        }
        std::vector<bool> abHadMesh;
        abHadMesh.resize(mScene->mNumMeshes,false);
        for (unsigned int i = 0; i < pNode->mNumMeshes;++i)
        {
            if (pNode->mMeshes[i] >= mScene->mNumMeshes)
            {
                ReportError("aiNode::mMeshes[%i] is out of range for node %s (maximum is %i)",
                    pNode->mMeshes[i], nodeName, mScene->mNumMeshes-1);
            }
            if (abHadMesh[pNode->mMeshes[i]])
            {
                ReportError("aiNode::mMeshes[%i] is already referenced by this node %s (value: %i)",
                    i, nodeName, pNode->mMeshes[i]);
            }
            abHadMesh[pNode->mMeshes[i]] = true;
        }
    }
    if (pNode->mNumChildren)
    {
        if (!pNode->mChildren)  {
            ReportError("aiNode::mChildren is NULL for node %s (aiNode::mNumChildren is %i)",
            		nodeName, pNode->mNumChildren);
        }
        for (unsigned int i = 0; i < pNode->mNumChildren;++i)   {
            Validate(pNode->mChildren[i]);
        }
    }
}